

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pbVar1;
  size_t __n;
  _func_int **pp_Var2;
  size_t size;
  DescriptorPool *this_01;
  pointer pcVar3;
  StringPiece name;
  int iVar4;
  const_iterator cVar5;
  char *pcVar6;
  Type *pTVar7;
  FileDescriptor *pFVar8;
  undefined8 *puVar9;
  long lVar10;
  DescriptorPool *this_02;
  long lVar11;
  size_type *psVar12;
  Tables *pTVar13;
  bool bVar14;
  FileDescriptorProto existing_proto;
  string local_148;
  string local_128;
  FileDescriptorProto local_108;
  
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  pTVar13 = this->tables_;
  local_108.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)(this->filename_)._M_dataplus._M_p;
  local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (this->filename_)._M_string_length;
  if (local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (local_108.super_Message.super_MessageLite._internal_metadata_.ptr_,
               "string length exceeds max size");
  }
  cVar5 = std::
          _Hashtable<google::protobuf::stringpiece_internal::StringPiece,_std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(pTVar13->files_by_name_)._M_h,(key_type *)&local_108);
  if ((cVar5.
       super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
       ._M_cur != (__node_type *)0x0) &&
     (pFVar8 = *(FileDescriptor **)
                ((long)cVar5.
                       super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
                       ._M_cur + 0x18), pFVar8 != (FileDescriptor *)0x0)) {
    FileDescriptorProto::FileDescriptorProto(&local_108,(Arena *)0x0,false);
    FileDescriptor::CopyTo(pFVar8,&local_108);
    if ((pFVar8[0x3a] == (FileDescriptor)0x2) && (((proto->_has_bits_).has_bits_[0] & 4) != 0)) {
      pcVar6 = FileDescriptor::SyntaxName(SYNTAX_PROTO2);
      local_108._has_bits_.has_bits_[0]._0_1_ = (byte)local_108._has_bits_.has_bits_[0] | 4;
      puVar9 = (undefined8 *)
               (local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ &
               0xfffffffffffffffc);
      if ((local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
        puVar9 = (undefined8 *)*puVar9;
      }
      internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                (&local_108.syntax_,pcVar6,puVar9);
    }
    MessageLite::SerializeAsString_abi_cxx11_(&local_128,(MessageLite *)&local_108);
    MessageLite::SerializeAsString_abi_cxx11_(&local_148,(MessageLite *)proto);
    if (local_128._M_string_length == local_148._M_string_length) {
      if (local_128._M_string_length == 0) {
        bVar14 = true;
      }
      else {
        iVar4 = bcmp(local_128._M_dataplus._M_p,local_148._M_dataplus._M_p,
                     local_128._M_string_length);
        bVar14 = iVar4 == 0;
      }
    }
    else {
      bVar14 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    FileDescriptorProto::~FileDescriptorProto(&local_108);
    if (bVar14) {
      return pFVar8;
    }
  }
  pTVar13 = this->tables_;
  pbVar1 = (pTVar13->pending_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(pTVar13->pending_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar10 != 0) {
    lVar10 = lVar10 >> 5;
    puVar9 = (undefined8 *)((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    __n = puVar9[1];
    psVar12 = &pbVar1->_M_string_length;
    lVar11 = 0;
    do {
      if ((*psVar12 == __n) &&
         ((__n == 0 ||
          (iVar4 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar12 + -1))->_M_dataplus)._M_p,(void *)*puVar9,__n), iVar4 == 0)))) {
        AddRecursiveImportError(this,proto,(int)lVar11);
        goto LAB_0034f969;
      }
      lVar11 = lVar11 + 1;
      psVar12 = psVar12 + 4;
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
  }
  if ((this->pool_->lazily_build_dependencies_ == false) &&
     (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pTVar13->pending_files_,
                (value_type *)((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      this_00 = &proto->dependency_;
      iVar4 = 0;
      do {
        pTVar13 = this->tables_;
        pTVar7 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,iVar4);
        pp_Var2 = (_func_int **)(pTVar7->_M_dataplus)._M_p;
        size = pTVar7->_M_string_length;
        if ((long)size < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (size,"string length exceeds max size");
        }
        local_108.super_Message.super_MessageLite._vptr_MessageLite = pp_Var2;
        local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ = size;
        cVar5 = std::
                _Hashtable<google::protobuf::stringpiece_internal::StringPiece,_std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pTVar13->files_by_name_)._M_h,(key_type *)&local_108);
        if ((cVar5.
             super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
             ._M_cur == (__node_type *)0x0) ||
           (*(long *)((long)cVar5.
                            super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
                            ._M_cur + 0x18) == 0)) {
          this_02 = this->pool_;
          this_01 = this_02->underlay_;
          if (this_01 != (DescriptorPool *)0x0) {
            pTVar7 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&this_00->super_RepeatedPtrFieldBase,iVar4);
            pFVar8 = DescriptorPool::FindFileByName(this_01,pTVar7);
            if (pFVar8 != (FileDescriptor *)0x0) goto LAB_0034f8c0;
            this_02 = this->pool_;
          }
          pTVar7 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,iVar4);
          name.ptr_ = (pTVar7->_M_dataplus)._M_p;
          name.length_ = pTVar7->_M_string_length;
          if ((long)pTVar7->_M_string_length < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (pTVar7->_M_string_length,"string length exceeds max size");
          }
          DescriptorPool::TryFindFileInFallbackDatabase(this_02,name);
        }
LAB_0034f8c0:
        iVar4 = iVar4 + 1;
      } while (iVar4 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    pTVar13 = this->tables_;
    pbVar1 = (pTVar13->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (pTVar13->pending_files_).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
    pcVar3 = pbVar1[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar1[-1].field_2) {
      operator_delete(pcVar3);
      pTVar13 = this->tables_;
    }
  }
  DescriptorPool::Tables::AddCheckpoint(pTVar13);
  pFVar8 = BuildFileImpl(this,proto);
  FileDescriptorTables::FinalizeTables(this->file_tables_);
  if (pFVar8 == (FileDescriptor *)0x0) {
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
LAB_0034f969:
    pFVar8 = (FileDescriptor *)0x0;
  }
  else {
    DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
    pFVar8[0x39] = (FileDescriptor)0x1;
  }
  return pFVar8;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file, proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (size_t i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = BuildFileImpl(proto);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
  } else {
    tables_->RollbackToLastCheckpoint();
  }

  return result;
}